

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ClassNameResolver *pCVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  FieldDescriptor *pFVar5;
  FieldGeneratorInfo *pFVar6;
  Descriptor *pDVar7;
  Nullable<const_char_*> failure_msg;
  int i;
  int iVar8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  Type local_64;
  LogMessageFatal local_60;
  string local_50;
  
  text._M_str = "private byte memoizedIsInitialized = -1;\n";
  text._M_len = 0x29;
  io::Printer::Print<>(printer,text);
  text_00._M_str = "@java.lang.Override\npublic final boolean isInitialized() {\n";
  text_00._M_len = 0x3b;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_01._M_str =
       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
  ;
  text_01._M_len = 0x78;
  io::Printer::Print<>(printer,text_01);
  iVar8 = 0;
  while( true ) {
    pDVar7 = (this->super_MessageGenerator).descriptor_;
    iVar3 = pDVar7->field_count_;
    if (iVar3 <= iVar8) break;
    pFVar5 = Descriptor::field(pDVar7,iVar8);
    pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar5);
    bVar2 = FieldDescriptor::is_required(pFVar5);
    if (bVar2) {
      text_02._M_str = "if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n";
      text_02._M_len = 0x43;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text_02,(char (*) [5])0xd8d1e3,&pFVar6->capitalized_name);
    }
    iVar8 = iVar8 + 1;
  }
  iVar8 = 0;
  do {
    if (iVar3 <= iVar8) {
      if (0 < pDVar7->extension_range_count_) {
        text_07._M_str =
             "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
        ;
        text_07._M_len = 0x52;
        io::Printer::Print<>(printer,text_07);
      }
      io::Printer::Outdent(printer);
      text_08._M_str = "  memoizedIsInitialized = 1;\n";
      text_08._M_len = 0x1d;
      io::Printer::Print<>(printer,text_08);
      text_09._M_str = "  return true;\n}\n\n";
      text_09._M_len = 0x12;
      io::Printer::Print<>(printer,text_09);
      return;
    }
    pFVar5 = Descriptor::field(pDVar7,iVar8);
    pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar5);
    JVar4 = GetJavaType(pFVar5);
    if (JVar4 == JAVATYPE_MESSAGE) {
      pDVar7 = FieldDescriptor::message_type(pFVar5);
      bVar2 = HasRequiredFields(pDVar7);
      if (bVar2) {
        bVar2 = FieldDescriptor::is_required(pFVar5);
        if (bVar2) {
          pCVar1 = this->name_resolver_;
          pDVar7 = FieldDescriptor::message_type(pFVar5);
          ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                    (&local_50,pCVar1,pDVar7);
          text_03._M_str =
               "if (!get$name$().isInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
          ;
          text_03._M_len = 0x53;
          io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                    (printer,text_03,(char (*) [5])0xde104b,&local_50,(char (*) [5])0xd8d1e3,
                     &pFVar6->capitalized_name);
        }
        else {
          bVar2 = FieldDescriptor::is_repeated(pFVar5);
          if (!bVar2) {
            text_05._M_str =
                 "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
            ;
            text_05._M_len = 0x70;
            io::Printer::Print<char[5],std::__cxx11::string>
                      (printer,text_05,(char (*) [5])0xd8d1e3,&pFVar6->capitalized_name);
            goto LAB_00b9d2e7;
          }
          pDVar7 = FieldDescriptor::message_type(pFVar5);
          if ((pDVar7->options_->field_0)._impl_.map_entry_ == true) {
            pDVar7 = FieldDescriptor::message_type(pFVar5);
            pCVar1 = this->name_resolver_;
            pFVar5 = Descriptor::map_value(pDVar7);
            local_60.super_LogMessage.errno_saver_.saved_errno_ = 0xb;
            local_64 = (Type)pFVar5->type_;
            failure_msg = absl::lts_20250127::log_internal::
                          Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                                    ((Type *)&local_60,&local_64,
                                     "FieldDescriptor::TYPE_MESSAGE == value_field->type()");
            if (failure_msg != (Nullable<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_60,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/full/message.cc"
                         ,0x39,failure_msg);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_60);
            }
            pDVar7 = FieldDescriptor::message_type(pFVar5);
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      (&local_50,pCVar1,pDVar7);
            text_04._M_str =
                 "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
            ;
            text_04._M_len = 0x84;
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (printer,text_04,(char (*) [5])0xde104b,&local_50,(char (*) [5])0xd8d1e3,
                       &pFVar6->capitalized_name);
          }
          else {
            pCVar1 = this->name_resolver_;
            pDVar7 = FieldDescriptor::message_type(pFVar5);
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      (&local_50,pCVar1,pDVar7);
            text_06._M_str =
                 "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
            ;
            text_06._M_len = 0x8b;
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (printer,text_06,(char (*) [5])0xde104b,&local_50,(char (*) [5])0xd8d1e3,
                       &pFVar6->capitalized_name);
          }
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
LAB_00b9d2e7:
    iVar8 = iVar8 + 1;
    pDVar7 = (this->super_MessageGenerator).descriptor_;
    iVar3 = pDVar7->field_count_;
  } while( true );
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO:  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      if (field->is_required()) {
        printer->Print(
            "if (!get$name$().isInitialized()) {\n"
            "  memoizedIsInitialized = 0;\n"
            "  return false;\n"
            "}\n",
            "type",
            name_resolver_->GetImmutableClassName(field->message_type()),
            "name", info->capitalized_name);
      } else if (field->is_repeated()) {
        if (IsMapEntry(field->message_type())) {
          printer->Print(
              "for ($type$ item : get$name$Map().values()) {\n"
              "  if (!item.isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type",
              MapValueImmutableClassdName(field->message_type(),
                                          name_resolver_),
              "name", info->capitalized_name);
        } else {
          printer->Print(
              "for (int i = 0; i < get$name$Count(); i++) {\n"
              "  if (!get$name$(i).isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
        }
      } else {
        printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    memoizedIsInitialized = 0;\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "name", info->capitalized_name);
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}